

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

bool pbrt::ToGrid(Point3f *p,Bounds3f *bounds,int *gridRes,Point3i *pi)

{
  int *piVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  ulong uVar6;
  int iVar8;
  float fVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined1 auVar12 [12];
  bool bVar13;
  int *piVar14;
  int i;
  int iVar15;
  long lVar16;
  bool bVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  uVar5 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar19._4_4_ = uVar7;
  auVar19._0_4_ = uVar5;
  auVar19._8_8_ = 0;
  uVar6._0_4_ = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6._4_4_ = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar6;
  auVar20 = vsubps_avx(auVar19,auVar22);
  fVar3 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  fVar4 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x;
  if ((float)(undefined4)uVar6 < fVar4) {
    auVar12 = auVar20._4_12_;
    auVar20._0_4_ = auVar20._0_4_ / (fVar4 - (float)(undefined4)uVar6);
    auVar20._4_12_ = auVar12;
  }
  fVar9 = (p->super_Tuple3<pbrt::Point3,_float>).z - fVar3;
  fVar4 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  auVar19 = vmovshdup_avx(auVar22);
  if (auVar19._0_4_ < fVar4) {
    auVar22 = vmovshdup_avx(auVar20);
    auVar23._0_4_ = auVar22._0_4_ / (fVar4 - auVar19._0_4_);
    auVar23._4_12_ = auVar22._4_12_;
    auVar20 = vinsertps_avx(auVar20,auVar23,0x10);
  }
  fVar4 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  uVar10 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar4),1);
  bVar11 = (bool)((byte)uVar10 & 1);
  auVar19 = vmovshdup_avx(auVar20);
  piVar1 = &(pi->super_Tuple3<pbrt::Point3,_int>).y;
  piVar2 = &(pi->super_Tuple3<pbrt::Point3,_int>).z;
  bVar13 = true;
  lVar16 = 0;
  do {
    iVar15 = (int)lVar16;
    fVar21 = auVar20._0_4_;
    if ((iVar15 != 0) && (fVar21 = auVar19._0_4_, iVar15 != 1)) {
      fVar21 = (float)((uint)bVar11 * (int)(fVar9 / (fVar4 - fVar3)) + (uint)!bVar11 * (int)fVar9);
    }
    piVar14 = (int *)pi;
    if ((iVar15 != 0) && (piVar14 = piVar1, iVar15 != 1)) {
      piVar14 = piVar2;
    }
    *piVar14 = (int)(fVar21 * (float)gridRes[lVar16]);
    piVar14 = (int *)pi;
    if ((iVar15 != 0) && (piVar14 = piVar1, iVar15 != 1)) {
      piVar14 = piVar2;
    }
    if (*piVar14 < 0) {
      bVar17 = false;
    }
    else {
      piVar14 = (int *)pi;
      if ((iVar15 != 0) && (piVar14 = piVar1, iVar15 != 1)) {
        piVar14 = piVar2;
      }
      bVar17 = *piVar14 < gridRes[lVar16];
    }
    piVar14 = (int *)pi;
    if ((iVar15 != 0) && (piVar14 = piVar1, iVar15 != 1)) {
      piVar14 = piVar2;
    }
    iVar8 = *piVar14;
    iVar18 = gridRes[lVar16] + -1;
    if (iVar8 < gridRes[lVar16] + -1) {
      iVar18 = iVar8;
    }
    if (iVar8 < 0) {
      iVar18 = 0;
    }
    piVar14 = (int *)pi;
    if ((iVar15 != 0) && (piVar14 = piVar1, iVar15 != 1)) {
      piVar14 = piVar2;
    }
    bVar13 = (bool)(bVar13 & bVar17);
    *piVar14 = iVar18;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  return bVar13;
}

Assistant:

PBRT_CPU_GPU auto operator-(const Point3<U> &p) const
        -> Vector3<decltype(T{} - U{})> {
        DCHECK(!p.HasNaN());
        return {x - p.x, y - p.y, z - p.z};
    }